

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::parseURL(Token *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  variant_alternative_t<2UL,_variant<int,_double,_basic_string<char>,_bool,_char>_> *pvVar2;
  TokenizerException *this_00;
  string url;
  regex url_regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_48;
  
  parseString((Token *)&url_regex,this,'`');
  pvVar2 = std::get<2ul,int,double,std::__cxx11::string,bool,char>
                     ((variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&url_regex._M_loc);
  std::__cxx11::string::string((string *)&url,(string *)pvVar2);
  std::__detail::__variant::
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&url_regex._M_loc);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&url_regex,"^(https?:\\/\\/)?([\\da-z\\.-]+)\\.([a-z\\.]{2,6})([\\/\\w \\.-]*)*\\/?$",
             0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (&url,&url_regex,0);
  if (bVar1) {
    std::__detail::__variant::_Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_48,&url);
    __return_storage_ptr__->type = String;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_48);
    std::__detail::__variant::
    _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::~_Variant_storage(&local_48);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&url_regex);
    std::__cxx11::string::~string((string *)&url);
    return __return_storage_ptr__;
  }
  this_00 = (TokenizerException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_68,"Malformed URL: ",&url);
  TokenizerException::TokenizerException
            (this_00,&local_68,this->line_number,this->col_number,&this->current_line);
  __cxa_throw(this_00,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Token Tokenizer::parseURL() {
    string url = get<string>(parseString('`').value);
    regex url_regex = std::regex(R"(^(https?:\/\/)?([\da-z\.-]+)\.([a-z\.]{2,6})([\/\w \.-]*)*\/?$)");
    if (!regex_match(url, url_regex)) {
        throw TokenizerException("Malformed URL: " + url, line_number, col_number, current_line);
    } else {
        // TODO: Possibly add a Url token?
        return Token(String, url);
    }
}